

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_animatable_timesamples<tinyusdz::value::texcoord2f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::texcoord2f> *v,
                   uint32_t indent)

{
  bool bVar1;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = Animatable<tinyusdz::value::texcoord2f>::has_timesamples(v);
  if (bVar1) {
    print_typed_timesamples<tinyusdz::value::texcoord2f>(&local_1d0,&v->_ts,indent);
    std::operator<<(local_1a0,(string *)&local_1d0);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_timesamples(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  std::stringstream ss;

  if (v.has_timesamples()) {
    ss << print_typed_timesamples(v.get_timesamples(), indent);
  }

  return ss.str();
}